

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

StringIntMap * __thiscall
glcts::LayoutBindingProgram::getBindingPoints
          (StringIntMap *__return_storage_ptr__,LayoutBindingProgram *this,StringVector *args)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict mVar2;
  GLenum GVar3;
  mapped_type_conflict *pmVar4;
  _Base_ptr p_Var5;
  _Self __tmp;
  GLint bindingPoint;
  StringIntMap locations;
  mapped_type_conflict local_7c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,args);
  getUniformLocations((StringIntMap *)&local_60,this,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        (*this->m_gl->getUniformiv)
                  ((this->m_program->m_program).m_program,p_Var5[2]._M_color,&local_7c);
        GVar3 = (*this->m_gl->getError)();
        mVar2 = local_7c;
        if (GVar3 == 0) {
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)(p_Var5 + 1));
          *pmVar4 = mVar2;
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

virtual StringIntMap getBindingPoints(StringVector args) const
	{
		StringIntMap bindingPoints;

		StringIntMap locations = getUniformLocations(args);
		if (!locations.empty())
		{
			glw::GLint bindingPoint;
			for (StringIntMap::iterator it = locations.begin(); it != locations.end(); it++)
			{
				glw::GLint location = it->second;
				m_gl.getUniformiv(getProgram(), location, &bindingPoint);
				bool hasNoError = (GL_NO_ERROR == m_gl.getError());
				if (hasNoError)
				{
					bindingPoints[it->first] = bindingPoint;
				}
			}
		}
		return bindingPoints;
	}